

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O2

void ORPG::Roll::PRINT_BASIC_HELP(void)

{
  fputs("roll (openrpg) v0.6.0 - (C) 2016-2025 Nicholas Gaulke\nOpenRPG Software License - Version 1.0 - February 10th, 2017 <https://openrpg.io/about/license/>\nThis is free software: you are free to change and redistribute it.\nThere is NO WARRANTY, to the extent permitted by law.\n\nUsage: roll [options] XdY [+|-] AdB [+|-] N [...]\n\nLong options may not be passed with a single dash.\nOpenRPG home page: < https://www.openrpg.io >\nReport bugs to: < https://github.com/incomingstick/OpenRPG/issues >\nSee \'man name-generator\' for more information [TODO add man pages].\n"
        ,_stdout);
  return;
}

Assistant:

void PRINT_BASIC_HELP() {
            fputs("roll (openrpg) " VERSION " - " COPYRIGHT "\n"
                "OpenRPG Software License - Version 1.0 - February 10th, 2017 <https://openrpg.io/about/license/>\n"
                "This is free software: you are free to change and redistribute it.\n"
                "There is NO WARRANTY, to the extent permitted by law.\n\n"
                "Usage: roll [options] XdY [+|-] AdB [+|-] N [...]\n"
                "\n"
                "Long options may not be passed with a single dash.\n"
                "OpenRPG home page: < https://www.openrpg.io >\n"
                "Report bugs to: < https://github.com/incomingstick/OpenRPG/issues >\n"
                "See 'man name-generator' for more information [TODO add man pages].\n",
                stdout);
        }